

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O2

void cgltf_write_line(cgltf_write_context *context,char *line)

{
  int iVar1;
  cgltf_size cVar2;
  size_t sVar3;
  
  if ((byte)(*line | 0x20U) == 0x7d) {
    context->depth = context->depth + -1;
    context->needs_comma = 0;
  }
  cgltf_write_indent(context);
  iVar1 = snprintf(context->cursor,context->remaining,"%s",line);
  cVar2 = (cgltf_size)iVar1;
  context->tmp = cVar2;
  context->chars_written = context->chars_written + cVar2;
  if (context->cursor != (char *)0x0) {
    context->cursor = context->cursor + cVar2;
    context->remaining = context->remaining - cVar2;
  }
  sVar3 = strlen(line);
  if ((byte)(*line | 0x20U) == 0x7d) {
    context->needs_comma = 1;
  }
  if ((byte)(line[sVar3 - 1] | 0x20U) == 0x7b) {
    context->depth = context->depth + 1;
    context->needs_comma = 0;
  }
  return;
}

Assistant:

static void cgltf_write_line(cgltf_write_context* context, const char* line)
{
	if (line[0] == ']' || line[0] == '}')
	{
		--context->depth;
		context->needs_comma = 0;
	}
	cgltf_write_indent(context);
	CGLTF_SPRINTF("%s", line);
	cgltf_size last = (cgltf_size)(strlen(line) - 1);
	if (line[0] == ']' || line[0] == '}')
	{
		context->needs_comma = 1;
	}
	if (line[last] == '[' || line[last] == '{')
	{
		++context->depth;
		context->needs_comma = 0;
	}
}